

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O0

ASkyViewpoint * __thiscall TActorIterator<ASkyViewpoint>::Next(TActorIterator<ASkyViewpoint> *this)

{
  bool bVar1;
  AActor *this_00;
  undefined1 local_21;
  AActor *actor;
  TActorIterator<ASkyViewpoint> *this_local;
  
  do {
    this_00 = FActorIterator::Next(&this->super_FActorIterator);
    local_21 = 0;
    if (this_00 != (AActor *)0x0) {
      bVar1 = DObject::IsKindOf((DObject *)this_00,ASkyViewpoint::RegistrationInfo.MyClass);
      local_21 = bVar1 ^ 0xff;
    }
  } while ((local_21 & 1) != 0);
  return (ASkyViewpoint *)this_00;
}

Assistant:

T *Next ()
	{
		AActor *actor;
		do
		{
			actor = FActorIterator::Next ();
		} while (actor && !actor->IsKindOf (RUNTIME_TEMPLATE_CLASS(T)));
		return static_cast<T *>(actor);
	}